

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

void set_activeblock(dmr_C *C,entrypoint *ep,basic_block *bb)

{
  int iVar1;
  basic_block *bb_local;
  entrypoint *ep_local;
  dmr_C *C_local;
  
  iVar1 = dmrC_bb_terminated(ep->active);
  if (iVar1 == 0) {
    add_goto(C,ep,bb);
  }
  ep->active = bb;
  iVar1 = dmrC_bb_reachable(bb);
  if (iVar1 != 0) {
    dmrC_add_bb(C,&ep->bbs,bb);
  }
  return;
}

Assistant:

static void set_activeblock(struct dmr_C *C, struct entrypoint *ep, struct basic_block *bb)
{
	if (!dmrC_bb_terminated(ep->active))
		add_goto(C, ep, bb);

	ep->active = bb;
	if (dmrC_bb_reachable(bb))
		dmrC_add_bb(C, &ep->bbs, bb);
}